

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  crnlib *this;
  uint uVar1;
  vec<3U,_float> *pvVar2;
  row_vec *prVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float local_83c;
  float local_834;
  float local_81c;
  float local_7fc;
  double local_7f8;
  float local_7d8;
  float local_7bc;
  float local_7a4;
  vec<3U,_float> *local_788;
  float total_variance;
  double right_dist2;
  double left_dist2;
  vec<3U,_float> *v_5;
  double dStack_758;
  uint i_6;
  double right_ttsum;
  double left_ttsum;
  vec<3U,_float> new_right_child_1;
  vec<3U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint64 right_weight;
  uint64 left_weight;
  vec<3U,_float> local_6f8;
  vec<3U,_float> local_6ec;
  double local_6e0;
  double t;
  vec<3U,_float> *pvStack_6d0;
  float weight_1;
  vec<3U,_float> *v_4;
  double dStack_6c0;
  uint i_5;
  double right_weight_1;
  double left_weight_1;
  vec<3U,_float> new_right_child;
  vec<3U,_float> new_left_child;
  uint j;
  double sum;
  double dStack_680;
  uint i_4;
  double max_sum;
  vec<3U,_float> x_2;
  uint iter;
  vec<3U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<3U,_float> w;
  vec<3U,_float> *v_3;
  undefined1 local_620 [4];
  uint i_3;
  matrix<3U,_3U,_float> covar;
  uint N;
  undefined1 local_5ec [8];
  vec<3U,_float> right_child;
  undefined1 local_5d4 [8];
  vec<3U,_float> left_child;
  double dist_1;
  vec<3U,_float> *v_2;
  double dStack_5b0;
  uint i_2;
  double opposite_dist;
  vec<3U,_float> opposite;
  double dist;
  vec<3U,_float> *v_1;
  double dStack_580;
  uint i_1;
  double furthest_dist;
  vec<3U,_float> furthest;
  float variance;
  uint weight;
  vec<3U,_float> *v;
  double dStack_548;
  uint i;
  double ttsum;
  uint64 total_weight;
  vec<3U,_float> centroid;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  vec<3U,_float> (*result_local) [2];
  uint size_local;
  uint (*weights_local) [64];
  vec<3U,_float> (*vectors_local) [64];
  
  local_788 = (vec<3U,_float> *)(weightedDotProducts + 0x3f);
  weightedVectors[0x3f].m_s._4_8_ = result;
  do {
    vec<3U,_float>::vec(local_788);
    local_788 = local_788 + 1;
  } while (local_788 != (vec<3U,_float> *)(weightedVectors[0x3f].m_s + 1));
  vec<3U,_float>::vec((vec<3U,_float> *)((long)&total_weight + 4),cClear);
  ttsum = 0.0;
  dStack_548 = 0.0;
  for (v._4_4_ = 0; v._4_4_ < size; v._4_4_ = v._4_4_ + 1) {
    pvVar2 = *vectors + v._4_4_;
    uVar1 = (*weights)[v._4_4_];
    operator*((crnlib *)(furthest.m_s + 2),pvVar2,(float)uVar1);
    vec<3U,_float>::operator=
              ((vec<3U,_float> *)(weightedVectors[(ulong)v._4_4_ - 1].m_s + 1),
               (vec<3U,_float> *)(furthest.m_s + 2));
    vec<3U,_float>::operator+=
              ((vec<3U,_float> *)((long)&total_weight + 4),
               (vec<3U,_float> *)(weightedVectors[(ulong)v._4_4_ - 1].m_s + 1));
    ttsum = (double)((long)ttsum + (ulong)uVar1);
    fVar5 = vec<3U,_float>::dot(pvVar2,pvVar2);
    weightedDotProducts[(ulong)v._4_4_ - 1] = (double)(fVar5 * (float)uVar1);
    dStack_548 = weightedDotProducts[(ulong)v._4_4_ - 1] + dStack_548;
  }
  fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)((long)&total_weight + 4),
                              (vec<3U,_float> *)((long)&total_weight + 4));
  local_7a4 = (float)(ulong)ttsum;
  furthest.m_s[1] = (float)(dStack_548 - (double)(fVar5 / local_7a4));
  local_7bc = (float)(ulong)ttsum;
  vec<3U,_float>::operator*=((vec<3U,_float> *)((long)&total_weight + 4),1.0 / local_7bc);
  pvVar2 = vec<3U,_float>::operator=
                     ((vec<3U,_float> *)(weightedVectors[0x3f].m_s._4_8_ + 0xc),
                      (vec<3U,_float> *)((long)&total_weight + 4));
  vec<3U,_float>::operator=((vec<3U,_float> *)weightedVectors[0x3f].m_s._4_8_,pvVar2);
  if ((0.0 < furthest.m_s[1]) && (size != 1)) {
    vec<3U,_float>::vec((vec<3U,_float> *)&furthest_dist);
    dStack_580 = -1.0;
    for (v_1._4_4_ = 0; v_1._4_4_ < size; v_1._4_4_ = v_1._4_4_ + 1) {
      fVar5 = vec<3U,_float>::squared_distance
                        (*vectors + v_1._4_4_,(vec<3U,_float> *)((long)&total_weight + 4));
      dVar8 = (double)fVar5;
      opposite.m_s._4_8_ = dVar8;
      if (dStack_580 < dVar8) {
        vec<3U,_float>::operator=((vec<3U,_float> *)&furthest_dist,*vectors + v_1._4_4_);
        dStack_580 = dVar8;
      }
    }
    vec<3U,_float>::vec((vec<3U,_float> *)((long)&opposite_dist + 4));
    dStack_5b0 = -1.0;
    for (v_2._4_4_ = 0; v_2._4_4_ < size; v_2._4_4_ = v_2._4_4_ + 1) {
      fVar5 = vec<3U,_float>::squared_distance
                        (*vectors + v_2._4_4_,(vec<3U,_float> *)&furthest_dist);
      dVar8 = (double)fVar5;
      left_child.m_s._4_8_ = dVar8;
      if (dStack_5b0 < dVar8) {
        vec<3U,_float>::operator=((vec<3U,_float> *)((long)&opposite_dist + 4),*vectors + v_2._4_4_)
        ;
        dStack_5b0 = dVar8;
      }
    }
    operator+((crnlib *)(right_child.m_s + 1),(vec<3U,_float> *)&furthest_dist,
              (vec<3U,_float> *)((long)&total_weight + 4));
    operator*((crnlib *)local_5d4,(vec<3U,_float> *)(right_child.m_s + 1),0.5);
    operator+((crnlib *)(covar.m_rows[2].m_s + 2),(vec<3U,_float> *)((long)&opposite_dist + 4),
              (vec<3U,_float> *)((long)&total_weight + 4));
    operator*((crnlib *)local_5ec,(vec<3U,_float> *)(covar.m_rows[2].m_s + 2),0.5);
    if (2 < size) {
      covar.m_rows[2].m_s[1] = 4.2039e-45;
      matrix<3U,_3U,_float>::matrix((matrix<3U,_3U,_float> *)local_620);
      matrix<3U,_3U,_float>::clear((matrix<3U,_3U,_float> *)local_620);
      for (v_3._4_4_ = 0; v_3._4_4_ < size; v_3._4_4_ = v_3._4_4_ + 1) {
        this = (crnlib *)(w.m_s + 1);
        operator-(this,*vectors + v_3._4_4_,(vec<3U,_float> *)((long)&total_weight + 4));
        operator*((crnlib *)&y,(vec<3U,_float> *)this,(float)(*weights)[v_3._4_4_]);
        for (divider = 0.0; (uint)divider < 3; divider = (float)((int)divider + 1)) {
          for (x_1 = (uint)divider; x_1 < 3; x_1 = x_1 + 1) {
            prVar3 = matrix<3U,_3U,_float>::operator[]
                               ((matrix<3U,_3U,_float> *)local_620,(uint)divider);
            pfVar4 = vec<3U,_float>::operator[](prVar3,x_1);
            fVar5 = *pfVar4;
            fVar6 = vec<3U,_float>::operator[]((vec<3U,_float> *)this,(uint)divider);
            fVar7 = vec<3U,_float>::operator[]((vec<3U,_float> *)&y,x_1);
            prVar3 = matrix<3U,_3U,_float>::operator[]
                               ((matrix<3U,_3U,_float> *)local_620,(uint)divider);
            pfVar4 = vec<3U,_float>::operator[](prVar3,x_1);
            *pfVar4 = fVar6 * fVar7 + fVar5;
          }
        }
      }
      local_7d8 = (float)(ulong)ttsum;
      for (axis.m_s[2] = 0.0; (uint)axis.m_s[2] < 3; axis.m_s[2] = (float)((int)axis.m_s[2] + 1)) {
        for (axis.m_s[1] = axis.m_s[2]; (uint)axis.m_s[1] < 3;
            axis.m_s[1] = (float)((int)axis.m_s[1] + 1)) {
          prVar3 = matrix<3U,_3U,_float>::operator[]
                             ((matrix<3U,_3U,_float> *)local_620,(uint)axis.m_s[2]);
          pfVar4 = vec<3U,_float>::operator[](prVar3,(uint)axis.m_s[1]);
          *pfVar4 = *pfVar4 / local_7d8;
          prVar3 = matrix<3U,_3U,_float>::operator[]
                             ((matrix<3U,_3U,_float> *)local_620,(uint)axis.m_s[2]);
          pfVar4 = vec<3U,_float>::operator[](prVar3,(uint)axis.m_s[1]);
          fVar5 = *pfVar4;
          prVar3 = matrix<3U,_3U,_float>::operator[]
                             ((matrix<3U,_3U,_float> *)local_620,(uint)axis.m_s[1]);
          pfVar4 = vec<3U,_float>::operator[](prVar3,(uint)axis.m_s[2]);
          *pfVar4 = fVar5;
        }
      }
      vec<3U,_float>::vec((vec<3U,_float> *)(x_2.m_s + 2),1.0);
      for (x_2.m_s[1] = 0.0; (uint)x_2.m_s[1] < 10; x_2.m_s[1] = (float)((int)x_2.m_s[1] + 1)) {
        vec<3U,_float>::vec((vec<3U,_float> *)&max_sum);
        dStack_680 = 0.0;
        for (sum._4_4_ = 0; sum._4_4_ < 3; sum._4_4_ = sum._4_4_ + 1) {
          stack0xfffffffffffff970 = 0.0;
          for (new_left_child.m_s[1] = 0.0; (uint)new_left_child.m_s[1] < 3;
              new_left_child.m_s[1] = (float)((int)new_left_child.m_s[1] + 1)) {
            pfVar4 = vec<3U,_float>::operator[]
                               ((vec<3U,_float> *)(x_2.m_s + 2),(uint)new_left_child.m_s[1]);
            fVar5 = *pfVar4;
            prVar3 = matrix<3U,_3U,_float>::operator[]((matrix<3U,_3U,_float> *)local_620,sum._4_4_)
            ;
            pfVar4 = vec<3U,_float>::operator[](prVar3,(uint)new_left_child.m_s[1]);
            register0x00001200 = (double)(fVar5 * *pfVar4) + stack0xfffffffffffff970;
          }
          pfVar4 = vec<3U,_float>::operator[]((vec<3U,_float> *)&max_sum,sum._4_4_);
          *pfVar4 = (float)stack0xfffffffffffff970;
          if (sum._4_4_ == 0) {
            local_7f8 = stack0xfffffffffffff970;
          }
          else {
            local_7f8 = math::maximum<double>(dStack_680,stack0xfffffffffffff970);
          }
          dStack_680 = local_7f8;
        }
        if ((dStack_680 != 0.0) || (NAN(dStack_680))) {
          vec<3U,_float>::operator*=((vec<3U,_float> *)&max_sum,(float)(1.0 / dStack_680));
        }
        vec<3U,_float>::operator=((vec<3U,_float> *)(x_2.m_s + 2),(vec<3U,_float> *)&max_sum);
      }
      vec<3U,_float>::normalize((vec<3U,_float> *)(x_2.m_s + 2),(vec<3U,_float> *)0x0);
      vec<3U,_float>::vec((vec<3U,_float> *)(new_right_child.m_s + 1),0.0);
      vec<3U,_float>::vec((vec<3U,_float> *)((long)&left_weight_1 + 4),0.0);
      right_weight_1 = 0.0;
      dStack_6c0 = 0.0;
      for (v_4._4_4_ = 0; v_4._4_4_ < size; v_4._4_4_ = v_4._4_4_ + 1) {
        pvStack_6d0 = *vectors + v_4._4_4_;
        t._4_4_ = (float)(*weights)[v_4._4_4_];
        operator-((crnlib *)&local_6ec,pvStack_6d0,(vec<3U,_float> *)((long)&total_weight + 4));
        fVar5 = operator*(&local_6ec,(vec<3U,_float> *)(x_2.m_s + 2));
        local_6e0 = (double)fVar5;
        if (0.0 <= local_6e0) {
          vec<3U,_float>::operator+=
                    ((vec<3U,_float> *)((long)&left_weight_1 + 4),
                     (vec<3U,_float> *)(weightedVectors[(ulong)v_4._4_4_ - 1].m_s + 1));
          dStack_6c0 = (double)t._4_4_ + dStack_6c0;
        }
        else {
          vec<3U,_float>::operator+=
                    ((vec<3U,_float> *)(new_right_child.m_s + 1),
                     (vec<3U,_float> *)(weightedVectors[(ulong)v_4._4_4_ - 1].m_s + 1));
          right_weight_1 = (double)t._4_4_ + right_weight_1;
        }
      }
      if ((0.0 < right_weight_1) && (0.0 < dStack_6c0)) {
        operator*((crnlib *)&local_6f8,(vec<3U,_float> *)(new_right_child.m_s + 1),
                  (float)(1.0 / right_weight_1));
        vec<3U,_float>::operator=((vec<3U,_float> *)local_5d4,&local_6f8);
        operator*((crnlib *)((long)&left_weight + 4),(vec<3U,_float> *)((long)&left_weight_1 + 4),
                  (float)(1.0 / dStack_6c0));
        vec<3U,_float>::operator=
                  ((vec<3U,_float> *)local_5ec,(vec<3U,_float> *)((long)&left_weight + 4));
      }
    }
    right_variance = 1e+10;
    for (new_left_child_1.m_s[1] = 0.0; (uint)new_left_child_1.m_s[1] < 0x400;
        new_left_child_1.m_s[1] = (float)((int)new_left_child_1.m_s[1] + 1)) {
      vec<3U,_float>::vec((vec<3U,_float> *)(new_right_child_1.m_s + 1),cClear);
      vec<3U,_float>::vec((vec<3U,_float> *)((long)&left_ttsum + 4),cClear);
      right_ttsum = 0.0;
      dStack_758 = 0.0;
      right_weight = 0;
      _left_variance = 0;
      for (v_5._4_4_ = 0; v_5._4_4_ < size; v_5._4_4_ = v_5._4_4_ + 1) {
        fVar5 = vec<3U,_float>::squared_distance((vec<3U,_float> *)local_5d4,*vectors + v_5._4_4_);
        fVar6 = vec<3U,_float>::squared_distance((vec<3U,_float> *)local_5ec,*vectors + v_5._4_4_);
        if (fVar6 <= fVar5) {
          vec<3U,_float>::operator+=
                    ((vec<3U,_float> *)((long)&left_ttsum + 4),
                     (vec<3U,_float> *)(weightedVectors[(ulong)v_5._4_4_ - 1].m_s + 1));
          dStack_758 = weightedDotProducts[(ulong)v_5._4_4_ - 1] + dStack_758;
          _left_variance = (*weights)[v_5._4_4_] + _left_variance;
        }
        else {
          vec<3U,_float>::operator+=
                    ((vec<3U,_float> *)(new_right_child_1.m_s + 1),
                     (vec<3U,_float> *)(weightedVectors[(ulong)v_5._4_4_ - 1].m_s + 1));
          right_ttsum = weightedDotProducts[(ulong)v_5._4_4_ - 1] + right_ttsum;
          right_weight = (*weights)[v_5._4_4_] + right_weight;
        }
      }
      if (right_weight == 0) {
        return;
      }
      if (_left_variance == 0) {
        return;
      }
      pfVar4 = new_right_child_1.m_s + 1;
      fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)pfVar4,(vec<3U,_float> *)pfVar4);
      local_7fc = (float)right_weight;
      fVar6 = vec<3U,_float>::dot((vec<3U,_float> *)((long)&left_ttsum + 4),
                                  (vec<3U,_float> *)((long)&left_ttsum + 4));
      local_81c = (float)_left_variance;
      local_834 = (float)right_weight;
      vec<3U,_float>::operator*=((vec<3U,_float> *)pfVar4,1.0 / local_834);
      local_83c = (float)_left_variance;
      vec<3U,_float>::operator*=((vec<3U,_float> *)((long)&left_ttsum + 4),1.0 / local_83c);
      vec<3U,_float>::operator=
                ((vec<3U,_float> *)local_5d4,(vec<3U,_float> *)(new_right_child_1.m_s + 1));
      vec<3U,_float>::operator=
                ((vec<3U,_float> *)local_5ec,(vec<3U,_float> *)((long)&left_ttsum + 4));
      fVar5 = (float)(right_ttsum - (double)(fVar5 / local_7fc)) +
              (float)(dStack_758 - (double)(fVar6 / local_81c));
      if ((fVar5 < 1e-05) || ((right_variance - fVar5) / fVar5 < 1e-05)) break;
      right_variance = fVar5;
    }
    vec<3U,_float>::operator=
              ((vec<3U,_float> *)weightedVectors[0x3f].m_s._4_8_,(vec<3U,_float> *)local_5d4);
    vec<3U,_float>::operator=
              ((vec<3U,_float> *)(weightedVectors[0x3f].m_s._4_8_ + 0xc),(vec<3U,_float> *)local_5ec
              );
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }